

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge(Nwk_Grf_t *p,Nwk_Vrt_t *pVert)

{
  int local_2c;
  Nwk_Vrt_t *pNStack_28;
  int k;
  Nwk_Vrt_t *pMinCost;
  Nwk_Vrt_t *pThis;
  Nwk_Vrt_t *pVert_local;
  Nwk_Grf_t *p_local;
  
  pNStack_28 = (Nwk_Vrt_t *)0x0;
  for (local_2c = 0; local_2c < pVert->nEdges; local_2c = local_2c + 1) {
    if ((pNStack_28 == (Nwk_Vrt_t *)0x0) ||
       (p->pVerts[(&pVert[1].Id)[local_2c]]->nEdges < pNStack_28->nEdges)) {
      pNStack_28 = p->pVerts[(&pVert[1].Id)[local_2c]];
    }
  }
  return pNStack_28;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge( Nwk_Grf_t * p, Nwk_Vrt_t * pVert )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k;
    Nwk_VertexForEachAdjacent( p, pVert, pThis, k )
    {
        if ( pMinCost == NULL || pMinCost->nEdges > pThis->nEdges )
            pMinCost = pThis;
    }
    return pMinCost;
}